

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O0

void __thiscall VRasterizer::rasterize(VRasterizer *this,VPath *path,FillRule fillRule,VRect *clip)

{
  bool bVar1;
  element_type *this_00;
  VRleTask *this_01;
  VRleTask *in_RCX;
  EVP_PKEY_CTX *in_RSI;
  VRect *in_RDI;
  VPath *in_stack_ffffffffffffffb8;
  FillRule fillRule_00;
  VPath *in_stack_ffffffffffffffd8;
  
  init((VRasterizer *)in_RDI,in_RSI);
  fillRule_00 = (FillRule)((ulong)in_RSI >> 0x38);
  bVar1 = VPath::empty((VPath *)0x1322b7);
  if (bVar1) {
    std::__shared_ptr_access<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1322c7);
    VRasterizerImpl::rle((VRasterizerImpl *)0x1322cf);
    VRle::reset((VRle *)0x1322d7);
  }
  else {
    this_00 = std::
              __shared_ptr_access<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1322e3);
    this_01 = VRasterizerImpl::task(this_00);
    VPath::VPath((VPath *)this_01,in_stack_ffffffffffffffb8);
    VRleTask::update(in_RCX,in_stack_ffffffffffffffd8,fillRule_00,in_RDI);
    VPath::~VPath((VPath *)0x132324);
    updateRequest((VRasterizer *)in_RCX);
  }
  return;
}

Assistant:

void VRasterizer::rasterize(VPath path, FillRule fillRule, const VRect &clip)
{
    init();
    if (path.empty()) {
        d->rle().reset();
        return;
    }
    d->task().update(std::move(path), fillRule, clip);
    updateRequest();
}